

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# val_VecStr.cpp
# Opt level: O2

void __thiscall mbc::Val::VecStr::VecStr(VecStr *this)

{
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *pfVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar2;
  _Any_data local_48;
  _Manager_type local_38;
  _Invoker_type local_30;
  allocator local_19;
  
  _ValAtom::_ValAtom(&this->super__ValAtom);
  (this->super__ValAtom).super_ValBase._vptr_ValBase = (_func_int **)&PTR__VecStr_0013ea18;
  pvVar2 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)operator_new(0x18);
  (pvVar2->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pvVar2->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar2->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->value_ = pvVar2;
  pfVar1 = (this->super__ValAtom).vaild_checker_;
  local_48._M_unused._0_8_ = (undefined8)*(undefined8 *)&(pfVar1->super__Function_base)._M_functor;
  local_48._8_8_ = *(undefined8 *)((long)&(pfVar1->super__Function_base)._M_functor + 8);
  *(undefined8 *)&(pfVar1->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(pfVar1->super__Function_base)._M_functor + 8) = 0;
  local_38 = (pfVar1->super__Function_base)._M_manager;
  (pfVar1->super__Function_base)._M_manager =
       std::
       _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/PeterlitsZo[P]MessageBookCli/src/val/val_VecStr.cpp:26:24)>
       ::_M_manager;
  local_30 = pfVar1->_M_invoker;
  pfVar1->_M_invoker =
       std::
       _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/PeterlitsZo[P]MessageBookCli/src/val/val_VecStr.cpp:26:24)>
       ::_M_invoke;
  std::_Function_base::~_Function_base((_Function_base *)&local_48);
  std::__cxx11::string::assign((char *)(this->super__ValAtom).super_ValBase.invaild_waring_);
  *(this->super__ValAtom).super_ValBase.type_ = VECSTR;
  std::__cxx11::string::string((string *)local_48._M_pod_data,"[]",&local_19);
  _ValAtom::set(&this->super__ValAtom,(string *)&local_48);
  std::__cxx11::string::~string((string *)local_48._M_pod_data);
  return;
}

Assistant:

VecStr::VecStr() : _ValAtom() {
    value_          = new vector<string>();

    *vaild_checker_  = [](const string& str){return true;};
    *invaild_waring_ = "[invaild vecstr]";
    *type_           = Type(VECSTR);
    
    set("[]");
}